

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O0

void __thiscall
duckdb::BaseAppender::AppendValueInternal<int,unsigned_int>
          (BaseAppender *this,Vector *col,int input)

{
  uint uVar1;
  uint *puVar2;
  idx_t iVar3;
  long in_RDI;
  int unaff_retaddr;
  
  uVar1 = Cast::Operation<int,unsigned_int>(unaff_retaddr);
  puVar2 = FlatVector::GetData<unsigned_int>((Vector *)0x93d723);
  iVar3 = DataChunk::size((DataChunk *)(in_RDI + 0x48));
  puVar2[iVar3] = uVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}